

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error
adios2_variable_shape_with_memory_space
          (size_t *shape,adios2_variable *variable,adios2_memory_space mem)

{
  DataType DVar1;
  DataType DVar2;
  DataType DVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  adios2_memory_space in_EDX;
  long in_RSI;
  Dims shapeCpp_14;
  Variable<std::complex<double>_> *variable_15;
  Dims shapeCpp_13;
  Variable<std::complex<float>_> *variable_14;
  Dims shapeCpp_12;
  Variable<long_double> *variable_13;
  Dims shapeCpp_11;
  Variable<double> *variable_12;
  Dims shapeCpp_10;
  Variable<float> *variable_11;
  Dims shapeCpp_9;
  Variable<unsigned_long> *variable_10;
  Dims shapeCpp_8;
  Variable<unsigned_int> *variable_9;
  Dims shapeCpp_7;
  Variable<unsigned_short> *variable_8;
  Dims shapeCpp_6;
  Variable<unsigned_char> *variable_7;
  Dims shapeCpp_5;
  Variable<long> *variable_6;
  Dims shapeCpp_4;
  Variable<int> *variable_5;
  Dims shapeCpp_3;
  Variable<short> *variable_4;
  Dims shapeCpp_2;
  Variable<signed_char> *variable_3;
  Dims shapeCpp_1;
  Variable<char> *variable_2;
  Dims shapeCpp;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_1;
  DataType typeCpp;
  VariableBase *variableBase;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff718;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff728;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff730;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff738;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff740;
  undefined8 local_898;
  undefined8 local_870;
  undefined8 local_848;
  string *in_stack_fffffffffffff7d8;
  undefined8 uVar4;
  adios2_variable *in_stack_fffffffffffff7e0;
  undefined8 local_7f8;
  undefined8 local_7d0;
  undefined8 local_7a8;
  undefined8 local_780;
  undefined8 local_758;
  undefined8 local_730;
  undefined8 local_708;
  undefined8 local_6e0;
  undefined8 local_6b8;
  undefined8 local_690;
  undefined1 local_620 [24];
  undefined1 local_608 [48];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_5d8;
  unsigned_long *local_5d0;
  unsigned_long *local_5c8;
  undefined1 local_5c0 [24];
  undefined1 local_5a8 [48];
  undefined8 local_578;
  unsigned_long *local_570;
  unsigned_long *local_568;
  undefined1 local_560 [24];
  undefined1 local_548 [48];
  undefined8 local_518;
  unsigned_long *local_510;
  unsigned_long *local_508;
  undefined1 local_500 [24];
  undefined1 local_4e8 [48];
  undefined8 local_4b8;
  unsigned_long *local_4b0;
  unsigned_long *local_4a8;
  undefined1 local_4a0 [24];
  undefined1 local_488 [48];
  undefined8 local_458;
  unsigned_long *local_450;
  unsigned_long *local_448;
  undefined1 local_440 [24];
  undefined1 local_428 [48];
  undefined8 local_3f8;
  unsigned_long *local_3f0;
  unsigned_long *local_3e8;
  undefined1 local_3e0 [24];
  undefined1 local_3c8 [48];
  undefined8 local_398;
  unsigned_long *local_390;
  unsigned_long *local_388;
  undefined1 local_380 [24];
  undefined1 local_368 [48];
  undefined8 local_338;
  unsigned_long *local_330;
  unsigned_long *local_328;
  undefined1 local_320 [24];
  undefined1 local_308 [48];
  undefined8 local_2d8;
  unsigned_long *local_2d0;
  unsigned_long *local_2c8;
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [48];
  undefined8 local_278;
  unsigned_long *local_270;
  unsigned_long *local_268;
  undefined1 local_260 [24];
  undefined1 local_248 [48];
  undefined8 local_218;
  unsigned_long *local_210;
  unsigned_long *local_208;
  undefined1 local_200 [24];
  undefined1 local_1e8 [48];
  undefined8 local_1b8;
  unsigned_long *local_1b0;
  unsigned_long *local_1a8;
  undefined1 local_1a0 [24];
  undefined1 local_188 [48];
  undefined8 local_158;
  unsigned_long *local_150;
  unsigned_long *local_148;
  undefined1 local_140 [24];
  undefined1 local_128 [48];
  undefined8 local_f8;
  unsigned_long *local_f0;
  unsigned_long *local_e8;
  undefined1 local_e0 [24];
  undefined1 local_c8 [48];
  undefined8 local_98;
  DataType local_8c;
  long local_88;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  adios2_memory_space local_1c;
  long local_18;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for const adios2_variable, in call to adios2_variable_shape",&local_41);
  adios2::helper::CheckForNullptr<adios2_variable_const>
            (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"for size_t* shape, in call to adios2_variable_shape",&local_79);
  adios2::helper::CheckForNullptr<unsigned_long>
            ((unsigned_long *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_88 = local_18;
  DVar1 = *(DataType *)(local_18 + 0x28);
  if (DVar1 != Struct) {
    local_8c = DVar1;
    DVar2 = adios2::helper::GetDataType<std::__cxx11::string>();
    DVar3 = local_8c;
    if (DVar1 == DVar2) {
      if (local_88 == 0) {
        local_690 = 0;
      }
      else {
        local_690 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      }
      local_98 = local_690;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16ab99);
      uVar4 = local_98;
      if (local_1c == adios2_memory_space_host) {
        adios2::core::VariableBase::Shape((ulong)local_c8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (in_stack_fffffffffffff730);
      }
      else {
        adios2_ToMemorySpace(local_1c);
        adios2::core::VariableBase::Shape((ulong)local_e0,(MemorySpace)uVar4,~RowMajor);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (in_stack_fffffffffffff730);
      }
      local_e8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           (in_stack_fffffffffffff718);
      local_f0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           (in_stack_fffffffffffff718);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                 (unsigned_long *)in_stack_fffffffffffff730);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffff730)
      ;
    }
    else {
      DVar2 = adios2::helper::GetDataType<char>();
      DVar1 = local_8c;
      if (DVar3 == DVar2) {
        if (local_88 == 0) {
          local_6b8 = 0;
        }
        else {
          local_6b8 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<char>::typeinfo,0);
        }
        local_f8 = local_6b8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16ad61);
        uVar4 = local_f8;
        if (local_1c == adios2_memory_space_host) {
          adios2::core::VariableBase::Shape((ulong)local_128);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (in_stack_fffffffffffff730);
        }
        else {
          adios2_ToMemorySpace(local_1c);
          adios2::core::VariableBase::Shape((ulong)local_140,(MemorySpace)uVar4,~RowMajor);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (in_stack_fffffffffffff730);
        }
        local_148 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              (in_stack_fffffffffffff718);
        local_150 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              (in_stack_fffffffffffff718);
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                  (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                   (unsigned_long *)in_stack_fffffffffffff730);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (in_stack_fffffffffffff730);
      }
      else {
        DVar2 = adios2::helper::GetDataType<signed_char>();
        DVar3 = local_8c;
        if (DVar1 == DVar2) {
          if (local_88 == 0) {
            local_6e0 = 0;
          }
          else {
            local_6e0 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                       &adios2::core::Variable<signed_char>::typeinfo,0);
          }
          local_158 = local_6e0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16af29);
          uVar4 = local_158;
          if (local_1c == adios2_memory_space_host) {
            adios2::core::VariableBase::Shape((ulong)local_188);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      (in_stack_fffffffffffff730);
          }
          else {
            adios2_ToMemorySpace(local_1c);
            adios2::core::VariableBase::Shape((ulong)local_1a0,(MemorySpace)uVar4,~RowMajor);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      (in_stack_fffffffffffff730);
          }
          local_1a8 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                (in_stack_fffffffffffff718);
          local_1b0 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                (in_stack_fffffffffffff718);
          std::
          copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                    (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                     (unsigned_long *)in_stack_fffffffffffff730);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (in_stack_fffffffffffff730);
        }
        else {
          DVar2 = adios2::helper::GetDataType<short>();
          DVar1 = local_8c;
          if (DVar3 == DVar2) {
            if (local_88 == 0) {
              local_708 = 0;
            }
            else {
              local_708 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                         &adios2::core::Variable<short>::typeinfo,0);
            }
            local_1b8 = local_708;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b0f1);
            uVar4 = local_1b8;
            if (local_1c == adios2_memory_space_host) {
              adios2::core::VariableBase::Shape((ulong)local_1e8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        (in_stack_fffffffffffff730);
            }
            else {
              adios2_ToMemorySpace(local_1c);
              adios2::core::VariableBase::Shape((ulong)local_200,(MemorySpace)uVar4,~RowMajor);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        (in_stack_fffffffffffff730);
            }
            local_208 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                  (in_stack_fffffffffffff718);
            local_210 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  (in_stack_fffffffffffff718);
            std::
            copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                      (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                       (unsigned_long *)in_stack_fffffffffffff730);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      (in_stack_fffffffffffff730);
          }
          else {
            DVar2 = adios2::helper::GetDataType<int>();
            DVar3 = local_8c;
            if (DVar1 == DVar2) {
              if (local_88 == 0) {
                local_730 = 0;
              }
              else {
                local_730 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                           &adios2::core::Variable<int>::typeinfo,0);
              }
              local_218 = local_730;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b2b9);
              uVar4 = local_218;
              if (local_1c == adios2_memory_space_host) {
                adios2::core::VariableBase::Shape((ulong)local_248);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          (in_stack_fffffffffffff730);
              }
              else {
                adios2_ToMemorySpace(local_1c);
                adios2::core::VariableBase::Shape((ulong)local_260,(MemorySpace)uVar4,~RowMajor);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          (in_stack_fffffffffffff730);
              }
              local_268 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    (in_stack_fffffffffffff718);
              local_270 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    (in_stack_fffffffffffff718);
              std::
              copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                        (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                         (unsigned_long *)in_stack_fffffffffffff730);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        (in_stack_fffffffffffff730);
            }
            else {
              DVar2 = adios2::helper::GetDataType<long>();
              DVar1 = local_8c;
              if (DVar3 == DVar2) {
                if (local_88 == 0) {
                  local_758 = 0;
                }
                else {
                  local_758 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                             &adios2::core::Variable<long>::typeinfo,0);
                }
                local_278 = local_758;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b481);
                uVar4 = local_278;
                if (local_1c == adios2_memory_space_host) {
                  adios2::core::VariableBase::Shape((ulong)local_2a8);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                            (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            (in_stack_fffffffffffff730);
                }
                else {
                  adios2_ToMemorySpace(local_1c);
                  adios2::core::VariableBase::Shape((ulong)local_2c0,(MemorySpace)uVar4,~RowMajor);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                            (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            (in_stack_fffffffffffff730);
                }
                local_2c8 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                      (in_stack_fffffffffffff718);
                local_2d0 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                      (in_stack_fffffffffffff718);
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                          (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                           (unsigned_long *)in_stack_fffffffffffff730);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          (in_stack_fffffffffffff730);
              }
              else {
                DVar2 = adios2::helper::GetDataType<unsigned_char>();
                DVar3 = local_8c;
                if (DVar1 == DVar2) {
                  if (local_88 == 0) {
                    local_780 = 0;
                  }
                  else {
                    local_780 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                               &adios2::core::Variable<unsigned_char>::typeinfo,0);
                  }
                  local_2d8 = local_780;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b649);
                  uVar4 = local_2d8;
                  if (local_1c == adios2_memory_space_host) {
                    adios2::core::VariableBase::Shape((ulong)local_308);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                              (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              (in_stack_fffffffffffff730);
                  }
                  else {
                    adios2_ToMemorySpace(local_1c);
                    adios2::core::VariableBase::Shape((ulong)local_320,(MemorySpace)uVar4,~RowMajor)
                    ;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                              (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              (in_stack_fffffffffffff730);
                  }
                  local_328 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                        (in_stack_fffffffffffff718);
                  local_330 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                        (in_stack_fffffffffffff718);
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                            (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                             (unsigned_long *)in_stack_fffffffffffff730);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            (in_stack_fffffffffffff730);
                }
                else {
                  DVar2 = adios2::helper::GetDataType<unsigned_short>();
                  DVar1 = local_8c;
                  if (DVar3 == DVar2) {
                    if (local_88 == 0) {
                      local_7a8 = 0;
                    }
                    else {
                      local_7a8 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<unsigned_short>::typeinfo,0
                                                );
                    }
                    local_338 = local_7a8;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b811);
                    uVar4 = local_338;
                    if (local_1c == adios2_memory_space_host) {
                      adios2::core::VariableBase::Shape((ulong)local_368);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                (in_stack_fffffffffffff730);
                    }
                    else {
                      adios2_ToMemorySpace(local_1c);
                      adios2::core::VariableBase::Shape
                                ((ulong)local_380,(MemorySpace)uVar4,~RowMajor);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                (in_stack_fffffffffffff730);
                    }
                    local_388 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                          (in_stack_fffffffffffff718);
                    local_390 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                          (in_stack_fffffffffffff718);
                    std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                              (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                               (unsigned_long *)in_stack_fffffffffffff730);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              (in_stack_fffffffffffff730);
                  }
                  else {
                    DVar2 = adios2::helper::GetDataType<unsigned_int>();
                    DVar3 = local_8c;
                    if (DVar1 == DVar2) {
                      if (local_88 == 0) {
                        local_7d0 = 0;
                      }
                      else {
                        local_7d0 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                                   &adios2::core::Variable<unsigned_int>::typeinfo,0
                                                  );
                      }
                      local_398 = local_7d0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16b9d9);
                      uVar4 = local_398;
                      if (local_1c == adios2_memory_space_host) {
                        adios2::core::VariableBase::Shape((ulong)local_3c8);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  (in_stack_fffffffffffff730);
                      }
                      else {
                        adios2_ToMemorySpace(local_1c);
                        adios2::core::VariableBase::Shape
                                  ((ulong)local_3e0,(MemorySpace)uVar4,~RowMajor);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  (in_stack_fffffffffffff730);
                      }
                      local_3e8 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                            (in_stack_fffffffffffff718);
                      local_3f0 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                            (in_stack_fffffffffffff718);
                      std::
                      copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                                 (unsigned_long *)in_stack_fffffffffffff730);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                (in_stack_fffffffffffff730);
                    }
                    else {
                      DVar2 = adios2::helper::GetDataType<unsigned_long>();
                      DVar1 = local_8c;
                      if (DVar3 == DVar2) {
                        if (local_88 == 0) {
                          local_7f8 = 0;
                        }
                        else {
                          local_7f8 = __dynamic_cast(local_88,&adios2::core::VariableBase::typeinfo,
                                                     &adios2::core::Variable<unsigned_long>::
                                                      typeinfo,0);
                        }
                        local_3f8 = local_7f8;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16bba1
                                  );
                        uVar4 = local_3f8;
                        if (local_1c == adios2_memory_space_host) {
                          adios2::core::VariableBase::Shape((ulong)local_428);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    (in_stack_fffffffffffff730);
                        }
                        else {
                          adios2_ToMemorySpace(local_1c);
                          adios2::core::VariableBase::Shape
                                    ((ulong)local_440,(MemorySpace)uVar4,~RowMajor);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    (in_stack_fffffffffffff730);
                        }
                        local_448 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    begin(in_stack_fffffffffffff718);
                        local_450 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                              (in_stack_fffffffffffff718);
                        std::
                        copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                  (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                                   (unsigned_long *)in_stack_fffffffffffff730);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  (in_stack_fffffffffffff730);
                      }
                      else {
                        DVar2 = adios2::helper::GetDataType<float>();
                        DVar3 = local_8c;
                        if (DVar1 == DVar2) {
                          if (local_88 == 0) {
                            local_458 = 0;
                          }
                          else {
                            local_458 = __dynamic_cast(local_88,&adios2::core::VariableBase::
                                                                 typeinfo,
                                                       &adios2::core::Variable<float>::typeinfo,0);
                          }
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x16bd69);
                          if (local_1c == adios2_memory_space_host) {
                            adios2::core::VariableBase::Shape((ulong)local_488);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      (in_stack_fffffffffffff730);
                          }
                          else {
                            uVar4 = local_458;
                            adios2_ToMemorySpace(local_1c);
                            adios2::core::VariableBase::Shape
                                      ((ulong)local_4a0,(MemorySpace)uVar4,~RowMajor);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      (in_stack_fffffffffffff730);
                          }
                          local_4a8 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      begin(in_stack_fffffffffffff718);
                          local_4b0 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      end(in_stack_fffffffffffff718);
                          std::
                          copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                    (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                                     (unsigned_long *)in_stack_fffffffffffff730);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    (in_stack_fffffffffffff730);
                        }
                        else {
                          DVar2 = adios2::helper::GetDataType<double>();
                          DVar1 = local_8c;
                          if (DVar3 == DVar2) {
                            if (local_88 == 0) {
                              local_848 = 0;
                            }
                            else {
                              local_848 = __dynamic_cast(local_88,&adios2::core::VariableBase::
                                                                   typeinfo,
                                                         &adios2::core::Variable<double>::typeinfo,0
                                                        );
                            }
                            local_4b8 = local_848;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x16bf31);
                            uVar4 = local_4b8;
                            if (local_1c == adios2_memory_space_host) {
                              adios2::core::VariableBase::Shape((ulong)local_4e8);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                        (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        (in_stack_fffffffffffff730);
                            }
                            else {
                              adios2_ToMemorySpace(local_1c);
                              adios2::core::VariableBase::Shape
                                        ((ulong)local_500,(MemorySpace)uVar4,~RowMajor);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                        (in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        (in_stack_fffffffffffff730);
                            }
                            local_508 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        begin(in_stack_fffffffffffff718);
                            local_510 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        end(in_stack_fffffffffffff718);
                            std::
                            copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                      (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                                       (unsigned_long *)in_stack_fffffffffffff730);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      (in_stack_fffffffffffff730);
                          }
                          else {
                            DVar2 = adios2::helper::GetDataType<long_double>();
                            DVar3 = local_8c;
                            if (DVar1 == DVar2) {
                              if (local_88 == 0) {
                                local_870 = 0;
                              }
                              else {
                                local_870 = __dynamic_cast(local_88,&adios2::core::VariableBase::
                                                                     typeinfo,
                                                           &adios2::core::Variable<long_double>::
                                                            typeinfo,0);
                              }
                              local_518 = local_870;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x16c0f0);
                              uVar4 = local_518;
                              if (local_1c == adios2_memory_space_host) {
                                adios2::core::VariableBase::Shape((ulong)local_548);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator=(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          (in_stack_fffffffffffff730);
                              }
                              else {
                                adios2_ToMemorySpace(local_1c);
                                adios2::core::VariableBase::Shape
                                          ((ulong)local_560,(MemorySpace)uVar4,~RowMajor);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator=(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          (in_stack_fffffffffffff730);
                              }
                              local_568 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::begin(in_stack_fffffffffffff718);
                              local_570 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::end(in_stack_fffffffffffff718);
                              std::
                              copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                        (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                                         (unsigned_long *)in_stack_fffffffffffff730);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        (in_stack_fffffffffffff730);
                            }
                            else {
                              DVar2 = adios2::helper::GetDataType<std::complex<float>>();
                              DVar1 = local_8c;
                              if (DVar3 == DVar2) {
                                if (local_88 == 0) {
                                  local_898 = 0;
                                }
                                else {
                                  local_898 = __dynamic_cast(local_88,&adios2::core::VariableBase::
                                                                       typeinfo,
                                                             &adios2::core::
                                                              Variable<std::complex<float>>::
                                                              typeinfo,0);
                                }
                                local_578 = local_898;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x16c297);
                                uVar4 = local_578;
                                if (local_1c == adios2_memory_space_host) {
                                  adios2::core::VariableBase::Shape((ulong)local_5a8);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  operator=(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector(in_stack_fffffffffffff730);
                                }
                                else {
                                  adios2_ToMemorySpace(local_1c);
                                  adios2::core::VariableBase::Shape
                                            ((ulong)local_5c0,(MemorySpace)uVar4,~RowMajor);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  operator=(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector(in_stack_fffffffffffff730);
                                }
                                local_5c8 = (unsigned_long *)
                                            std::
                                            vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                            begin(in_stack_fffffffffffff718);
                                local_5d0 = (unsigned_long *)
                                            std::
                                            vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                            end(in_stack_fffffffffffff718);
                                std::
                                copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                          (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                                           (unsigned_long *)in_stack_fffffffffffff730);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          (in_stack_fffffffffffff730);
                              }
                              else {
                                DVar3 = adios2::helper::GetDataType<std::complex<double>>();
                                if (DVar1 == DVar3) {
                                  if (local_88 == 0) {
                                    __first._M_current = (unsigned_long *)0x0;
                                  }
                                  else {
                                    __first._M_current =
                                         (unsigned_long *)
                                         __dynamic_cast(local_88,&adios2::core::VariableBase::
                                                                  typeinfo,
                                                        &adios2::core::
                                                         Variable<std::complex<double>>::typeinfo,0)
                                    ;
                                  }
                                  local_5d8 = (vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)__first._M_current;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x16c43e);
                                  if (local_1c == adios2_memory_space_host) {
                                    adios2::core::VariableBase::Shape((ulong)local_608);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    operator=(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector(in_stack_fffffffffffff730);
                                  }
                                  else {
                                    __x = local_5d8;
                                    adios2_ToMemorySpace(local_1c);
                                    adios2::core::VariableBase::Shape
                                              ((ulong)local_620,(MemorySpace)__x,~RowMajor);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    operator=(in_stack_fffffffffffff730,__x);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector(in_stack_fffffffffffff730);
                                  }
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                            (in_stack_fffffffffffff718);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                            (in_stack_fffffffffffff718);
                                  std::
                                  copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                            (__first,in_stack_fffffffffffff738,
                                             (unsigned_long *)in_stack_fffffffffffff730);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector(in_stack_fffffffffffff730);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_shape_with_memory_space(size_t *shape, const adios2_variable *variable,
                                                     adios2_memory_space mem)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_shape");
        adios2::helper::CheckForNullptr(shape, "for size_t* shape, in call to "
                                               "adios2_variable_shape");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        adios2::Dims shapeCpp;                                                                     \
        if (mem == adios2_memory_space_host)                                                       \
            shapeCpp = variable->Shape(adios2::EngineCurrentStep);                                 \
        else                                                                                       \
            shapeCpp = variable->Shape(adios2::EngineCurrentStep, adios2_ToMemorySpace(mem));      \
        std::copy(shapeCpp.begin(), shapeCpp.end(), shape);                                        \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_shape"));
    }
}